

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

CaseStatementSyntax * __thiscall
slang::parsing::Parser::parseCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority,
          Token caseKeyword)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> elements_00;
  string_view arg;
  Token uniqueOrPriority_00;
  Token caseKeyword_00;
  Token openParen_00;
  Token closeParen_00;
  Token matchesOrInside_00;
  Token endcase_00;
  anon_class_8_1_8991fb9c *parseItem;
  string_view sVar1;
  string_view sVar2;
  Token TVar3;
  bool bVar4;
  CaseStatementSyntax *pCVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Info *pIVar6;
  EVP_PKEY_CTX *src;
  Info *in_RSI;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Token TVar7;
  Token TVar8;
  string_view sVar9;
  Token endcase;
  bool errored;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  Token matchesOrInside;
  Token closeParen;
  ExpressionSyntax *caseExpr;
  Token openParen;
  ParserBase *in_stack_fffffffffffffca8;
  Parser *in_stack_fffffffffffffcb0;
  pointer in_stack_fffffffffffffcb8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffcc0;
  ParserBase *in_stack_fffffffffffffcd0;
  Diagnostic *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  Info *in_stack_fffffffffffffd00;
  ParserBase *in_stack_fffffffffffffd10;
  SourceLocation in_stack_fffffffffffffd18;
  DiagCode in_stack_fffffffffffffd24;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> *pSVar10;
  undefined6 uVar11;
  TokenKind in_stack_fffffffffffffd3e;
  undefined2 uVar12;
  ParserBase *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  Diagnostic *in_stack_fffffffffffffd50;
  SourceLocation in_stack_fffffffffffffd58;
  undefined6 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  Info *in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  undefined6 in_stack_fffffffffffffd90;
  TokenKind TVar13;
  Token *this_00;
  NamedLabelSyntax local_220;
  Token local_1e8;
  undefined8 local_1d8;
  Info *pIStack_1d0;
  undefined8 local_1c8;
  Info *pIStack_1c0;
  undefined8 local_1b8;
  Info *pIStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  Token local_150;
  string_view local_140;
  SourceLocation local_130;
  undefined4 local_124;
  Token local_100;
  Token local_e0;
  Token local_c0;
  bool local_a9;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_a8 [2];
  Token local_68;
  Token local_58;
  ExpressionSyntax *local_48;
  Token local_40;
  Info *local_30;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  this_00 = (Token *)&stack0x00000008;
  local_30 = in_RSI;
  local_20 = in_R8;
  uStack_18 = in_R9;
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  local_40 = ParserBase::expect(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3e);
  local_48 = parseExpression(in_stack_fffffffffffffcb0);
  local_58 = ParserBase::expect(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3e);
  Token::Token((Token *)in_stack_fffffffffffffcb0);
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> *)0x8d61e2);
  local_a9 = false;
  TVar7 = ParserBase::peek(in_stack_fffffffffffffca8);
  local_c0.kind = TVar7.kind;
  local_c0 = TVar7;
  if (local_c0.kind == InsideKeyword) {
    TVar13 = local_c0.kind;
    TVar8 = ParserBase::consume(in_stack_fffffffffffffcd0);
    local_100 = TVar8;
    local_68 = TVar8;
    in_stack_fffffffffffffd67 =
         parseCaseItems<slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__2,slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__3>
                   (TVar7._0_8_,TVar7.info._6_2_,in_RDI,(anon_class_1_0_00000001 *)this_00,
                    (anon_class_8_1_8991fb9c *)CONCAT26(TVar13,in_stack_fffffffffffffd90));
    local_a9 = (bool)in_stack_fffffffffffffd67;
  }
  else if (local_c0.kind == MatchesKeyword) {
    TVar13 = local_c0.kind;
    local_e0 = ParserBase::consume(in_stack_fffffffffffffcd0);
    local_68 = local_e0;
    local_a9 = parseCaseItems<slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__0,slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__1>
                         (TVar7._0_8_,TVar7.info._6_2_,in_RDI,(anon_class_1_0_00000001 *)this_00,
                          (anon_class_8_1_8991fb9c *)CONCAT26(TVar13,in_stack_fffffffffffffd90));
    TVar8.info = in_stack_fffffffffffffd68;
    TVar8.kind = (short)in_stack_fffffffffffffd70;
    TVar8._2_1_ = (char)((ulong)in_stack_fffffffffffffd70 >> 0x10);
    TVar8.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd70 >> 0x18);
    TVar8.rawLen = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  }
  else {
    parseItem = (anon_class_8_1_8991fb9c *)CONCAT26(local_c0.kind,in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd66 =
         parseCaseItems<slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__4,slang::parsing::Parser::parseCaseStatement(slang::syntax::NamedLabelSyntax*,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,slang::parsing::Token)::__5>
                   (TVar7._0_8_,TVar7.info._6_2_,in_RDI,(anon_class_1_0_00000001 *)this_00,parseItem
                   );
    TVar8.info = in_stack_fffffffffffffd68;
    TVar8.kind = (short)in_stack_fffffffffffffd70;
    TVar8._2_1_ = (char)((ulong)in_stack_fffffffffffffd70 >> 0x10);
    TVar8.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd70 >> 0x18);
    TVar8.rawLen = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    local_a9 = (bool)in_stack_fffffffffffffd66;
  }
  bVar4 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::empty(local_a8);
  sVar2._M_str = local_140._M_str;
  sVar2._M_len = local_140._M_len;
  sVar1._M_str = (char *)in_stack_fffffffffffffd40;
  sVar1._M_len = in_stack_fffffffffffffd48;
  sVar9._M_str = (char *)in_stack_fffffffffffffd40;
  sVar9._M_len = in_stack_fffffffffffffd48;
  if ((bVar4) && (sVar9 = sVar1, local_140 = sVar2, (local_a9 & 1U) == 0)) {
    local_124 = 0x50005;
    in_stack_fffffffffffffd58 = Token::location(this_00);
    local_130 = in_stack_fffffffffffffd58;
    in_stack_fffffffffffffd50 =
         ParserBase::addDiag(in_stack_fffffffffffffd10,in_stack_fffffffffffffd24,
                             in_stack_fffffffffffffd18);
    sVar9 = LexerFacts::getTokenKindText((TokenKind)((ulong)in_stack_fffffffffffffcb0 >> 0x30));
    arg._M_str = (char *)in_stack_fffffffffffffd00;
    arg._M_len = in_stack_fffffffffffffcf8;
    local_140 = sVar9;
    Diagnostic::operator<<(in_stack_fffffffffffffcf0,arg);
  }
  local_150 = ParserBase::expect((ParserBase *)sVar9._M_str,in_stack_fffffffffffffd3e);
  pIVar6 = local_150.info;
  uVar11 = local_150._0_6_;
  uVar12 = local_150.rawLen._2_2_;
  pSVar10 = in_RDI + 7;
  local_198 = local_10;
  uStack_190 = uStack_8;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffcc0._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffcb8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffcb0,
             elements);
  TVar3 = local_40;
  TVar7 = local_58;
  local_1a8 = local_20;
  uStack_1a0 = uStack_18;
  local_1b8._0_2_ = this_00->kind;
  local_1b8._2_1_ = this_00->field_0x2;
  local_1b8._3_1_ = this_00->numFlags;
  local_1b8._4_4_ = this_00->rawLen;
  pIStack_1b0 = this_00->info;
  local_1c8._0_2_ = local_40.kind;
  local_1c8._2_1_ = local_40._2_1_;
  local_1c8._3_1_ = local_40.numFlags.raw;
  local_1c8._4_4_ = local_40.rawLen;
  pIStack_1c0 = local_40.info;
  local_1d8._0_2_ = local_58.kind;
  local_1d8._2_1_ = local_58._2_1_;
  local_1d8._3_1_ = local_58.numFlags.raw;
  local_1d8._4_4_ = local_58.rawLen;
  pIStack_1d0 = local_58.info;
  local_58 = TVar7;
  local_40 = TVar3;
  local_1e8 = local_68;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy(local_a8,(EVP_PKEY_CTX *)in_RDI->data_,src)
  ;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffcc0._M_extent_value;
  elements_00._M_ptr = (pointer)in_stack_fffffffffffffcb8;
  slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::CaseItemSyntax> *)in_stack_fffffffffffffcb0,elements_00);
  uniqueOrPriority_00.info = in_stack_fffffffffffffd00;
  uniqueOrPriority_00._0_8_ = local_150.info;
  caseKeyword_00.info = local_30;
  caseKeyword_00._0_8_ = pSVar10;
  openParen_00.info._0_6_ = uVar11;
  openParen_00._0_8_ = pIVar6;
  openParen_00.info._6_2_ = uVar12;
  closeParen_00.info = (Info *)sVar9._M_len;
  closeParen_00._0_8_ = sVar9._M_str;
  matchesOrInside_00.info = (Info *)in_stack_fffffffffffffd58;
  matchesOrInside_00._0_8_ = in_stack_fffffffffffffd50;
  endcase_00.info = TVar8._0_8_;
  endcase_00._0_8_ = TVar8.info;
  pCVar5 = slang::syntax::SyntaxFactory::caseStatement
                     ((SyntaxFactory *)local_150._0_8_,&local_220,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1e8.info,
                      uniqueOrPriority_00,caseKeyword_00,openParen_00,
                      (ExpressionSyntax *)local_1e8._0_8_,closeParen_00,matchesOrInside_00,
                      (SyntaxList<slang::syntax::CaseItemSyntax> *)
                      CONCAT17(in_stack_fffffffffffffd67,
                               CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),
                      endcase_00);
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> *)0x8d66ed);
  return pCVar5;
}

Assistant:

CaseStatementSyntax& Parser::parseCaseStatement(NamedLabelSyntax* label, AttrList attributes,
                                                Token uniqueOrPriority, Token caseKeyword) {
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& caseExpr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    Token matchesOrInside;
    SmallVector<CaseItemSyntax*> itemBuffer;
    bool errored = false;

    switch (peek().kind) {
        case TokenKind::MatchesKeyword:
            // pattern matching case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossiblePattern(kind); },
                [this] {
                    auto& pattern = parsePattern();
                    Token tripleAnd;
                    ExpressionSyntax* patternExpr = nullptr;

                    if (peek(TokenKind::TripleAnd)) {
                        tripleAnd = consume();
                        patternExpr = &parseExpression();
                    }

                    auto colon = expect(TokenKind::Colon);
                    return &factory.patternCaseItem(pattern, tripleAnd, patternExpr, colon,
                                                    parseStatement());
                });
            break;
        case TokenKind::InsideKeyword:
            // range checking case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer,
                [](auto kind) { return isPossibleValueRangeElement(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleValueRangeElement, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedValueRangeElement,
                        [this] { return &parseValueRangeElement(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
        default:
            // normal case statement
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossibleExpression(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedExpression, [this] { return &parseExpression(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
    }

    if (itemBuffer.empty() && !errored) {
        addDiag(diag::CaseStatementEmpty, caseKeyword.location())
            << LexerFacts::getTokenKindText(caseKeyword.kind);
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseStatement(label, attributes, uniqueOrPriority, caseKeyword, openParen,
                                 caseExpr, closeParen, matchesOrInside, itemBuffer.copy(alloc),
                                 endcase);
}